

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
::split(btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
        *this,int insert_position,
       btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
       *dest,allocator_type *alloc)

{
  field_type fVar1;
  field_type fVar2;
  byte bVar3;
  bool bVar4;
  template_ElementType<1UL> *ptVar5;
  btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *pbVar6;
  template_ElementType<3UL> *ppbVar7;
  byte bVar8;
  int i;
  uint i_00;
  template_ElementType<2UL> *local_38;
  
  fVar1 = count(dest);
  if (fVar1 != '\0') {
    __assert_fail("dest->count() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8fb,
                  "void phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>]"
                 );
  }
  fVar1 = max_count(this);
  if (fVar1 == '\x1e') {
    if (insert_position == 0x1e) {
      bVar8 = 0;
    }
    else if (insert_position == 0) {
      fVar1 = count(this);
      bVar8 = fVar1 - 1;
    }
    else {
      bVar8 = count(this);
      bVar8 = bVar8 >> 1;
    }
    ptVar5 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
             ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                              *)dest);
    ptVar5[2] = bVar8;
    fVar1 = count(this);
    fVar2 = count(dest);
    ptVar5 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
             ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                              *)this);
    ptVar5[2] = fVar1 - fVar2;
    fVar1 = count(this);
    if (fVar1 != '\0') {
      bVar8 = count(dest);
      bVar3 = count(this);
      i_00 = 0;
      uninitialized_move_n(this,(ulong)bVar8,(ulong)bVar3,0,dest,alloc);
      bVar8 = count(this);
      bVar3 = count(dest);
      value_destroy_n(this,(ulong)bVar8,(ulong)bVar3,alloc);
      fVar1 = count(this);
      ptVar5 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
               ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                                *)this);
      ptVar5[2] = fVar1 + 0xff;
      pbVar6 = parent(this);
      bVar8 = position(this);
      bVar3 = count(this);
      local_38 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                 ::GetField<2ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                                  *)this);
      local_38 = local_38 + bVar3;
      btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
      ::emplace_value<phmap::priv::map_slot_type<int,int>*>
                ((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                  *)pbVar6,(ulong)bVar8,alloc,&local_38);
      bVar8 = count(this);
      value_destroy(this,(ulong)bVar8,alloc);
      pbVar6 = parent(this);
      bVar8 = position(this);
      init_child(pbVar6,bVar8 + 1,dest);
      bVar4 = leaf(this);
      if (!bVar4) {
        while( true ) {
          bVar8 = count(dest);
          if (bVar8 < i_00) break;
          bVar8 = count(this);
          ppbVar7 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                    ::GetField<3ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                                     *)this);
          if (ppbVar7[(ulong)(bVar8 + i_00) + 1] == (template_ElementType<3UL>)0x0) {
            __assert_fail("child(count() + i + 1) != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x91a,
                          "void phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>]"
                         );
          }
          bVar8 = count(this);
          ppbVar7 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                    ::GetField<3ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                                     *)this);
          init_child(dest,i_00,ppbVar7[(ulong)(bVar8 + i_00) + 1]);
          count(this);
          btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
          ::GetField<3ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                           *)this);
          i_00 = i_00 + 1;
        }
      }
      return;
    }
    __assert_fail("count() >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x90a,
                  "void phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>]"
                 );
  }
  __assert_fail("max_count() == kNodeValues",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x8fc,
                "void phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>]"
               );
}

Assistant:

void btree_node<P>::split(const int insert_position, btree_node *dest,
                              allocator_type *alloc) {
        assert(dest->count() == 0);
        assert(max_count() == kNodeValues);

        // We bias the split based on the position being inserted. If we're
        // inserting at the beginning of the left node then bias the split to put
        // more values on the right node. If we're inserting at the end of the
        // right node then bias the split to put more values on the left node.
        if (insert_position == 0) {
            dest->set_count((field_type)(count() - 1));
        } else if (insert_position == kNodeValues) {
            dest->set_count(0);
        } else {
            dest->set_count((field_type)(count() / 2));
        }
        set_count((field_type)(count() - dest->count()));
        assert(count() >= 1);

        // Move values from the left sibling to the right sibling.
        uninitialized_move_n(dest->count(), count(), 0, dest, alloc);

        // Destroy the now-empty entries in the left node.
        value_destroy_n(count(), dest->count(), alloc);

        // The split key is the largest value in the left sibling.
        set_count((field_type)(count() - 1));
        parent()->emplace_value(position(), alloc, slot(count()));
        value_destroy(count(), alloc);
        parent()->init_child(position() + 1, dest);

        if (!leaf()) {
            for (int i = 0; i <= dest->count(); ++i) {
                assert(child(count() + i + 1) != nullptr);
                dest->init_child(i, child(count() + i + 1));
                clear_child(count() + i + 1);
            }
        }
    }